

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

void fio_listen_cleanup_task(void *pr_)

{
  char *pcVar1;
  
  if (*(void **)((long)pr_ + 0x78) != (void *)0x0) {
    fio_tls_destroy(*(void **)((long)pr_ + 0x78));
  }
  if (*(code **)((long)pr_ + 0x50) != (code *)0x0) {
    (**(code **)((long)pr_ + 0x50))
              (*(undefined8 *)((long)pr_ + 0x30),*(undefined8 *)((long)pr_ + 0x38));
  }
  fio_force_close(*(intptr_t *)((long)pr_ + 0x30));
  if ((*(char **)((long)pr_ + 0x60) != (char *)0x0) &&
     ((((pcVar1 = *(char **)((long)pr_ + 0x58), pcVar1 == (char *)0x0 || (*pcVar1 == '\0')) ||
       ((*pcVar1 == '0' && (pcVar1[1] == '\0')))) &&
      ((fio_data->is_worker == '\0' || (fio_data->workers == 1)))))) {
    unlink(*(char **)((long)pr_ + 0x60));
  }
  free(pr_);
  return;
}

Assistant:

static void fio_listen_cleanup_task(void *pr_) {
  fio_listen_protocol_s *pr = pr_;
  if (pr->tls)
    fio_tls_destroy(pr->tls);
  if (pr->on_finish) {
    pr->on_finish(pr->uuid, pr->udata);
  }
  fio_force_close(pr->uuid);
  if (pr->addr &&
      (!pr->port || *pr->port == 0 ||
       (pr->port[0] == '0' && pr->port[1] == 0)) &&
      fio_is_master()) {
    /* delete Unix sockets */
    unlink(pr->addr);
  }
  free(pr_);
}